

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float64_unordered_quiet_mips64el(float64 a,float64 b,float_status *status)

{
  int iVar1;
  float64 a_;
  float64 a__00;
  int iVar2;
  
  a_ = float64_squash_input_denormal_mips64el(a,status);
  a__00 = float64_squash_input_denormal_mips64el(b,status);
  if (((~a_ & 0x7ff0000000000000) == 0 && (a_ & 0xfffffffffffff) != 0) ||
     (iVar2 = 0, (a__00 & 0xfffffffffffff) != 0 && (~a__00 & 0x7ff0000000000000) == 0)) {
    iVar1 = float64_is_signaling_nan_mips64el(a_,status);
    iVar2 = 1;
    if ((iVar1 == 0) && (iVar1 = float64_is_signaling_nan_mips64el(a__00,status), iVar1 == 0)) {
      return 1;
    }
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return iVar2;
}

Assistant:

int float64_unordered_quiet(float64 a, float64 b, float_status *status)
{
    a = float64_squash_input_denormal(a, status);
    b = float64_squash_input_denormal(b, status);

    if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
         || ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
       ) {
        if (float64_is_signaling_nan(a, status)
         || float64_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}